

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_has_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_idle_t h;
  
  loop = uv_default_loop();
  puVar2 = (uv_loop_t *)&stack0xffffffffffffff80;
  uv_idle_init(loop,(uv_idle_t *)puVar2);
  uv_ref((uv_handle_t *)puVar2);
  iVar1 = uv_has_ref((uv_handle_t *)puVar2);
  if (iVar1 == 1) {
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff80;
    uv_unref((uv_handle_t *)puVar2);
    iVar1 = uv_has_ref((uv_handle_t *)puVar2);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00167706;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_00167706:
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(has_ref) {
  uv_idle_t h;
  uv_idle_init(uv_default_loop(), &h);
  uv_ref((uv_handle_t*)&h);
  ASSERT(uv_has_ref((uv_handle_t*)&h) == 1);
  uv_unref((uv_handle_t*)&h);
  ASSERT(uv_has_ref((uv_handle_t*)&h) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}